

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMaterialSurfaceNSC.cpp
# Opt level: O1

void __thiscall
chrono::ChMaterialSurfaceNSC::ArchiveOUT(ChMaterialSurfaceNSC *this,ChArchiveOut *marchive)

{
  char *local_38;
  float *local_30;
  undefined1 local_28;
  
  ChArchiveOut::VersionWrite<chrono::ChMaterialSurfaceNSC>(marchive);
  ChMaterialSurface::ArchiveOUT(&this->super_ChMaterialSurface,marchive);
  local_30 = (float *)&(this->super_ChMaterialSurface).field_0x1c;
  local_38 = "cohesion";
  local_28 = 0;
  (*(marchive->super_ChArchive)._vptr_ChArchive[5])(marchive,&local_38);
  local_30 = &this->dampingf;
  local_38 = "dampingf";
  local_28 = 0;
  (*(marchive->super_ChArchive)._vptr_ChArchive[5])(marchive,&local_38);
  local_30 = &this->compliance;
  local_38 = "compliance";
  local_28 = 0;
  (*(marchive->super_ChArchive)._vptr_ChArchive[5])(marchive,&local_38);
  local_30 = &this->complianceT;
  local_38 = "complianceT";
  local_28 = 0;
  (*(marchive->super_ChArchive)._vptr_ChArchive[5])(marchive,&local_38);
  local_30 = &this->complianceRoll;
  local_38 = "complianceRoll";
  local_28 = 0;
  (*(marchive->super_ChArchive)._vptr_ChArchive[5])(marchive,&local_38);
  local_30 = &this->complianceSpin;
  local_38 = "complianceSpin";
  local_28 = 0;
  (*(marchive->super_ChArchive)._vptr_ChArchive[5])(marchive,&local_38);
  return;
}

Assistant:

void ChMaterialSurfaceNSC::ArchiveOUT(ChArchiveOut& marchive) {
    // version number
    marchive.VersionWrite<ChMaterialSurfaceNSC>();

    // serialize parent class
    ChMaterialSurface::ArchiveOUT(marchive);

    // serialize all member data:
    marchive << CHNVP(cohesion);
    marchive << CHNVP(dampingf);
    marchive << CHNVP(compliance);
    marchive << CHNVP(complianceT);
    marchive << CHNVP(complianceRoll);
    marchive << CHNVP(complianceSpin);
}